

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KokkosTime.cpp
# Opt level: O1

void anon_unknown.dwarf_62ab40::KokkosTime::kokkostime_register(Caliper *c,Channel *chn)

{
  int iVar1;
  Annotation *this;
  Events *pEVar2;
  ostream *poVar3;
  string local_278;
  _Any_data local_258;
  code *local_248;
  code *pcStack_240;
  _Any_data local_238;
  code *local_228;
  code *pcStack_220;
  undefined1 local_218 [248];
  ios_base local_120 [264];
  int local_18;
  
  this = (Annotation *)operator_new(0x10);
  cali::Annotation::Annotation(this,"region",0);
  cali::Annotation::Annotation(this + 1,"kernel_type",0x40);
  pEVar2 = cali::Channel::events(chn);
  local_238._8_8_ = 0;
  pcStack_220 = std::
                _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/services/kokkos/KokkosTime.cpp:80:45)>
                ::_M_invoke;
  local_228 = std::
              _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/services/kokkos/KokkosTime.cpp:80:45)>
              ::_M_manager;
  local_238._M_unused._M_object = this;
  std::
  vector<std::function<void_(cali::Caliper_*,_cali::Channel_*)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::Channel_*)>_>_>
  ::push_back(&(pEVar2->post_init_evt).mCb,(value_type *)&local_238);
  if (local_228 != (code *)0x0) {
    (*local_228)(&local_238,&local_238,__destroy_functor);
  }
  pEVar2 = cali::Channel::events(chn);
  local_258._8_8_ = 0;
  pcStack_240 = std::
                _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/services/kokkos/KokkosTime.cpp:107:42)>
                ::_M_invoke;
  local_248 = std::
              _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/services/kokkos/KokkosTime.cpp:107:42)>
              ::_M_manager;
  local_258._M_unused._M_object = this;
  std::
  vector<std::function<void_(cali::Caliper_*,_cali::Channel_*)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::Channel_*)>_>_>
  ::push_back(&(pEVar2->finish_evt).mCb,(value_type *)&local_258);
  if (local_248 != (code *)0x0) {
    (*local_248)(&local_258,&local_258,__destroy_functor);
  }
  poVar3 = (ostream *)local_218;
  std::ofstream::ofstream(poVar3);
  local_18 = 1;
  iVar1 = cali::Log::verbosity();
  if (local_18 <= iVar1) {
    poVar3 = cali::Log::get_stream((Log *)local_218);
  }
  cali::Channel::name_abi_cxx11_(&local_278,chn);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_278._M_dataplus._M_p,local_278._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": Registered kokkostime service",0x1f);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  local_218._0_8_ = _VTT;
  *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)(local_218 + 8));
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

static void kokkostime_register(Caliper* c, Channel* chn)
    {

        auto* instance = new KokkosTime(c, chn);
        chn->events().post_init_evt.connect([instance](Caliper* c, Channel* chn) {
            kokkosp_callbacks.kokkosp_begin_parallel_for_callback.connect(
                [&](const char* name, const uint32_t, uint64_t*) { instance->pushRegion(name, "kokkos.parallel_for"); }
            );
            kokkosp_callbacks.kokkosp_begin_parallel_reduce_callback.connect(
                [&](const char* name, const uint32_t, uint64_t*) {
                    instance->pushRegion(name, "kokkos.parallel_reduce");
                }
            );
            kokkosp_callbacks.kokkosp_begin_parallel_scan_callback.connect(
                [&](const char* name, const uint32_t, uint64_t*) { instance->pushRegion(name, "kokkos.parallel_scan"); }
            );
            kokkosp_callbacks.kokkosp_begin_fence_callback.connect([&](const char* name, const uint32_t, uint64_t*) {
                instance->pushRegion(name, "kokkos.fence");
            });
            kokkosp_callbacks.kokkosp_end_parallel_for_callback.connect([&](const uint64_t) { instance->popRegion(); });
            kokkosp_callbacks.kokkosp_end_parallel_reduce_callback.connect([&](const uint64_t) {
                instance->popRegion();
            });
            kokkosp_callbacks.kokkosp_end_parallel_scan_callback.connect([&](const uint64_t) { instance->popRegion(); }
            );
            kokkosp_callbacks.kokkosp_end_fence_callback.connect([&](const uint64_t) { instance->popRegion(); });
            kokkosp_callbacks.kokkosp_push_region_callback.connect([&](const char* regionName) {
                instance->pushRegion(regionName, "kokkos.user_region");
            });
            kokkosp_callbacks.kokkosp_pop_region_callback.connect([&]() { instance->popRegion(); });
        });
        chn->events().finish_evt.connect([instance](Caliper*, Channel*) { delete instance; });

        Log(1).stream() << chn->name() << ": Registered kokkostime service" << std::endl;
    }